

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  pointer pPVar1;
  pointer pFVar2;
  Ptr<const_Catch::IConfig> PVar3;
  pointer pFVar4;
  size_t sVar5;
  int iVar6;
  undefined4 extraout_var;
  TestSpecParser *this;
  IRegistryHub *pIVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  pointer pPVar9;
  TestCase *testCase;
  Ptr<const_Catch::IConfig> iconfig;
  Ptr<Catch::IStreamingReporter> reporter;
  RunContext context;
  Ptr<const_Catch::IConfig> local_388;
  Ptr<Catch::IStreamingReporter> local_380;
  Totals *local_378;
  Ptr<Catch::IStreamingReporter> local_370;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_368;
  TestCase *local_350;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [32];
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f0;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  TagAliasRegistry *local_2b0;
  string local_2a8;
  undefined1 local_288 [16];
  pointer local_278;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_268;
  RunContext local_248;
  
  local_388.m_p = (IConfig *)config->m_p;
  local_378 = __return_storage_ptr__;
  if ((Config *)local_388.m_p != (Config *)0x0) {
    (*(((Config *)local_388.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&local_380,config);
  local_370.m_p = local_380.m_p;
  if (local_380.m_p != (IStreamingReporter *)0x0) {
    (*((local_380.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  addListeners((Catch *)&local_248,&local_388,&local_370);
  Ptr<Catch::IStreamingReporter>::operator=(&local_380,(Ptr<Catch::IStreamingReporter> *)&local_248)
  ;
  if (local_248.super_IResultCapture._vptr_IResultCapture != (_func_int **)0x0) {
    (**(code **)(*local_248.super_IResultCapture._vptr_IResultCapture + 0x18))();
  }
  if (local_370.m_p != (IStreamingReporter *)0x0) {
    (*((local_370.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  RunContext::RunContext(&local_248,&local_388,&local_380);
  (local_378->testCases).failed = 0;
  (local_378->testCases).failedButOk = 0;
  *(undefined1 (*) [16])&(local_378->assertions).failedButOk = (undefined1  [16])0x0;
  (local_378->assertions).passed = 0;
  (local_378->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(local_318);
  RunContext::testGroupStarting(&local_248,(string *)local_318,1,1);
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_);
  }
  iVar6 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_368,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar6));
  if (local_368.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_368.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_2f8 = 0;
    aStack_2f0._M_local_buf[0] = '\0';
    local_2e0 = (undefined1  [16])0x0;
    local_2d0 = (undefined1  [16])0x0;
    local_2c0 = (undefined1  [16])0x0;
    local_2b0 = &TagAliasRegistry::get::instance;
    local_318._24_8_ = &aStack_2f0;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"~[.]","");
    this = TestSpecParser::parse((TestSpecParser *)local_318,&local_2a8);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_288,&(this->m_testSpec).m_filters);
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_368.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_368.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_368.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_368.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_278;
    local_368.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_288._0_8_;
    local_368.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_288._8_8_;
    local_288 = (undefined1  [16])0x0;
    local_278 = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_268);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               (local_2d0 + 8));
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._24_8_ != &aStack_2f0) {
      operator_delete((void *)local_318._24_8_);
    }
  }
  PVar3.m_p = local_388.m_p;
  pIVar7 = getRegistryHub();
  iVar6 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar6),PVar3.m_p);
  testCase = (TestCase *)*plVar8;
  local_350 = (TestCase *)plVar8[1];
  if (testCase != local_350) {
    local_328 = (undefined1  [16])0x0;
    local_338 = (undefined1  [16])0x0;
    local_348 = (undefined1  [16])0x0;
    do {
      sVar5 = local_248.m_totals.assertions.failed;
      iVar6 = (*((local_248.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])()
      ;
      pFVar4 = local_368.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      PVar3.m_p = local_388.m_p;
      pFVar2 = local_368.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar5 != (long)iVar6) {
        for (; pFVar2 != pFVar4; pFVar2 = pFVar2 + 1) {
          pPVar9 = (pFVar2->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar1 = (pFVar2->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (pPVar9 == pPVar1) {
              iVar6 = (*(((SharedImpl<Catch::IConfig> *)&(PVar3.m_p)->super_IShared)->super_IConfig)
                        .super_IShared.super_NonCopyable._vptr_NonCopyable[4])(PVar3.m_p);
              if (((char)iVar6 == '\0') &&
                 (((testCase->super_TestCaseInfo).properties & Throws) != None)) goto LAB_00142174;
              RunContext::runTest((Totals *)local_318,&local_248,testCase);
              local_328._0_8_ = local_318._0_8_ + local_328._0_8_;
              local_328._8_8_ = local_328._8_8_ + local_318._8_8_;
              (local_378->assertions).passed = local_328._0_8_;
              (local_378->assertions).failed = local_328._8_8_;
              local_338._0_8_ = local_338._0_8_ + local_318._16_8_;
              local_338._8_8_ = local_338._8_8_ + local_318._24_8_;
              (local_378->assertions).failedButOk = local_338._0_8_;
              (local_378->testCases).passed = local_338._8_8_;
              local_348._0_8_ = local_348._0_8_ + local_2f8;
              local_348._8_8_ =
                   local_348._8_8_ +
                   CONCAT71(aStack_2f0._M_allocated_capacity._1_7_,aStack_2f0._M_local_buf[0]);
              (local_378->testCases).failed = local_348._0_8_;
              (local_378->testCases).failedButOk = local_348._8_8_;
              goto LAB_00142185;
            }
            iVar6 = (*(pPVar9->m_p->super_SharedImpl<Catch::IShared>).super_IShared.
                      super_NonCopyable._vptr_NonCopyable[4])(pPVar9->m_p,testCase);
            if ((char)iVar6 == '\0') break;
            pPVar9 = pPVar9 + 1;
          }
        }
      }
LAB_00142174:
      (*((local_380.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                (local_380.m_p,testCase);
LAB_00142185:
      testCase = testCase + 1;
    } while (testCase != local_350);
  }
  (*(((SharedImpl<Catch::IConfig> *)&(local_388.m_p)->super_IShared)->super_IConfig).super_IShared.
    super_NonCopyable._vptr_NonCopyable[6])(local_318);
  RunContext::testGroupEnded(&local_248,(string *)local_318,local_378,1,1);
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_);
  }
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_368);
  RunContext::~RunContext(&local_248);
  if (local_380.m_p != (IStreamingReporter *)0x0) {
    (*((local_380.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  if ((Config *)local_388.m_p != (Config *)0x0) {
    (*(((SharedImpl<Catch::IConfig> *)&(local_388.m_p)->super_IShared)->super_IConfig).super_IShared
      .super_NonCopyable._vptr_NonCopyable[3])();
  }
  return local_378;
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }